

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_server_main.cpp
# Opt level: O0

void main_posix(settings *par)

{
  undefined4 uVar1;
  byte bVar2;
  undefined8 uVar3;
  ostream *poVar4;
  string *in_RDI;
  int sig;
  sigset_t wait_mask;
  tcp_cache_service srv;
  daemonizer demon;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  shared_ptr<cppcms::sessions::session_storage_factory> *in_stack_fffffffffffffe90;
  message local_138 [52];
  int local_104;
  sigset_t local_100;
  string local_80 [32];
  undefined1 local_60 [32];
  undefined1 local_40 [8];
  tcp_cache_service local_38 [8];
  daemonizer local_30 [40];
  string *local_8;
  
  local_8 = in_RDI;
  cppcms::impl::daemonizer::daemonizer(local_30,(value *)(in_RDI + 0x30));
  booster::intrusive_ptr<cppcms::impl::base_cache>::intrusive_ptr
            ((intrusive_ptr<cppcms::impl::base_cache> *)in_stack_fffffffffffffe90,
             (intrusive_ptr<cppcms::impl::base_cache> *)
             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  std::shared_ptr<cppcms::sessions::session_storage_factory>::shared_ptr
            (in_stack_fffffffffffffe90,
             (shared_ptr<cppcms::sessions::session_storage_factory> *)
             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  uVar1 = *(undefined4 *)(local_8 + 0x24);
  std::__cxx11::string::string(local_80,local_8);
  cppcms::impl::tcp_cache_service::tcp_cache_service
            (local_38,local_40,local_60,uVar1,local_80,*(undefined4 *)(local_8 + 0x20),
             *(undefined4 *)(local_8 + 0x28));
  std::__cxx11::string::~string(local_80);
  std::shared_ptr<cppcms::sessions::session_storage_factory>::~shared_ptr
            ((shared_ptr<cppcms::sessions::session_storage_factory> *)0x109713);
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr
            ((intrusive_ptr<cppcms::impl::base_cache> *)in_stack_fffffffffffffe90);
  sigemptyset(&local_100);
  sigaddset(&local_100,2);
  sigaddset(&local_100,3);
  sigaddset(&local_100,0xf);
  pthread_sigmask(0,&local_100,(__sigset_t *)0x0);
  local_104 = 0;
  sigwait(&local_100,&local_104);
  uVar3 = booster::log::logger::instance();
  bVar2 = booster::log::logger::should_be_logged(uVar3,0x32,"cppcms_scale");
  if ((bVar2 & 1) != 0) {
    booster::log::message::message
              (local_138,0x32,"cppcms_scale",
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/src/cache_server_main.cpp"
               ,0xca);
    poVar4 = (ostream *)booster::log::message::out();
    poVar4 = std::operator<<(poVar4,"Catch signal: exiting...");
    std::ios::operator_cast_to_bool((ios *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18)));
    booster::log::message::~message(local_138);
  }
  cppcms::impl::tcp_cache_service::stop();
  cppcms::impl::tcp_cache_service::~tcp_cache_service(local_38);
  cppcms::impl::daemonizer::~daemonizer(local_30);
  return;
}

Assistant:

void main_posix(settings &par)
{
	cppcms::impl::daemonizer demon(par.config);

	cppcms::impl::tcp_cache_service srv(
		par.cache,
		par.sessions,
		par.threads,
		par.ip,
		par.port,
		par.gc);
	
	// Wait for signals for exit
	sigset_t wait_mask;
	sigemptyset(&wait_mask);
	sigaddset(&wait_mask, SIGINT);
	sigaddset(&wait_mask, SIGQUIT);
	sigaddset(&wait_mask, SIGTERM);
	pthread_sigmask(SIG_BLOCK, &wait_mask, 0);
	int sig = 0;
	sigwait(&wait_mask, &sig);
	
	BOOSTER_NOTICE("cppcms_scale")<<"Catch signal: exiting...";

	srv.stop();
}